

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O1

double __thiscall opengv::math::Sturm::computeLagrangianBound(Sturm *this)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM3 [16];
  vector<double,_std::allocator<double>_> coefficients;
  vector<double,_std::allocator<double>_> local_58;
  double local_38;
  double local_30;
  double local_28;
  
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&local_58,this->_dimension - 1);
  if (this->_dimension != 1) {
    uVar5 = 0;
    do {
      uVar5 = uVar5 + 1;
      pdVar1 = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data;
      auVar6._0_8_ = pdVar1[(this->_C).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows * uVar5] / *pdVar1;
      auVar6._8_8_ = 0;
      auVar9._8_8_ = 0x7fffffffffffffff;
      auVar9._0_8_ = 0x7fffffffffffffff;
      auVar6 = vandpd_avx512vl(auVar6,auVar9);
      auVar9 = vcvtusi2sd_avx512f(in_XMM3,uVar5);
      local_28 = pow(auVar6._0_8_,1.0 / auVar9._0_8_);
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_28);
      }
      else {
        *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_28;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
    } while (uVar5 < this->_dimension - 1);
  }
  lVar2 = (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_30 = -1.0;
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar3 = 0;
    local_38 = -1.0;
  }
  else {
    auVar9 = ZEXT816(0xbff0000000000000);
    lVar4 = 0;
    lVar3 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar4];
      if (auVar9._0_8_ <
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4]) {
        lVar3 = lVar4;
      }
      auVar9 = vmaxsd_avx(auVar7,auVar9);
      local_38 = auVar9._0_8_;
      lVar4 = lVar4 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
  }
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar3] = -1.0;
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    auVar9 = ZEXT816(0xbff0000000000000);
    lVar3 = 0;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar3];
      auVar9 = vmaxsd_avx(auVar8,auVar9);
      local_30 = auVar9._0_8_;
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_38 + local_30;
}

Assistant:

double
opengv::math::Sturm::computeLagrangianBound()
{
  std::vector<double> coefficients;
  coefficients.reserve(_dimension-1);

  for(size_t i=0; i < _dimension-1; i++)
    coefficients.push_back(pow(fabs(_C(0,i+1)/_C(0,0)),(1.0/(i+1))));

  size_t j = 0;
  double max1 = -1.0;
  for( size_t i = 0; i < coefficients.size(); i++ )
  {
    if( coefficients[i] > max1 )
    {
      j = i;
      max1 = coefficients[i];
    }
  }

  coefficients[j] = -1.0;

  double max2 = -1.0;
  for( size_t i=0; i < coefficients.size(); i++ )
  {
    if( coefficients[i] > max2 )
      max2 = coefficients[i];
  }

  double bound = max1 + max2;
  return bound;
}